

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryBasicGeometryShaderTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::geometry::anon_unknown_0::BuiltinVariableRenderTest::createInstance
          (BuiltinVariableRenderTest *this,Context *context)

{
  Context **this_00;
  size_type *this_01;
  bool bVar1;
  pointer pVVar2;
  Context *pCVar3;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  VkBool32 VVar4;
  VkResult result;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  GeometryExpanderRenderTestInstance *this_02;
  DeviceInterface *vk;
  Allocation *device;
  Allocator *pAVar5;
  NotSupportedError *this_03;
  VariableTest VVar6;
  size_t __n;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *this_04;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *pvVar7;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_a8;
  undefined1 local_88 [24];
  VkAllocationCallbacks *pVStack_70;
  VkBufferCreateInfo indexBufferParams;
  
  VVar6 = this->m_test;
  if (VVar6 == TEST_POINT_SIZE) {
    vki = Context::getInstanceInterface(context);
    physDevice = Context::getPhysicalDevice(context);
    VVar4 = checkPointSize(vki,physDevice);
    if (VVar4 == 0) {
      this_03 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_03,"Missing feature: pointSize",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryBasicGeometryShaderTests.cpp"
                 ,0x45d);
      __cxa_throw(this_03,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    VVar6 = this->m_test;
  }
  this_02 = (GeometryExpanderRenderTestInstance *)operator_new(0xc0);
  bVar1 = this->m_flag;
  GeometryExpanderRenderTestInstance::GeometryExpanderRenderTestInstance
            (this_02,context,(uint)(VVar6 == TEST_PRIMITIVE_ID_IN) * 2,
             (this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  (this_02->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__BuiltinVariableRenderTestInstance_00c22658;
  *(bool *)&this_02[1].super_TestInstance._vptr_TestInstance = bVar1;
  this_00 = &this_02[1].super_TestInstance.m_context;
  this_01 = &this_02[1].m_name._M_string_length;
  this_04 = &this_02[1].m_vertexPosData;
  this_02[1].super_TestInstance.m_context = (Context *)0x0;
  *(undefined8 *)&this_02[1].m_primitiveType = 0;
  this_02[1].m_name._M_dataplus._M_p = (pointer)0x0;
  this_02[1].m_name._M_string_length = 0;
  this_02[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&this_02[1].m_name.field_2 + 8) = 0;
  *(undefined8 *)&this_02[1].m_numDrawVertices = 0;
  this_02[1].m_vertexPosData.
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this_02->m_numDrawVertices = 5;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this_02->m_vertexPosData,5);
  pVVar2 = (this_02->m_vertexPosData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar2->m_data[0] = 0.5;
  pVVar2->m_data[1] = 0.0;
  pVVar2->m_data[2] = 0.0;
  pVVar2->m_data[3] = 1.0;
  pVVar2 = (this_02->m_vertexPosData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar2[1].m_data[0] = 0.0;
  pVVar2[1].m_data[1] = 0.5;
  pVVar2[1].m_data[2] = 0.0;
  pVVar2[1].m_data[3] = 1.0;
  pVVar2 = (this_02->m_vertexPosData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar2[2].m_data[0] = -0.7;
  pVVar2[2].m_data[1] = -0.1;
  pVVar2[2].m_data[2] = 0.0;
  pVVar2[2].m_data[3] = 1.0;
  pVVar2 = (this_02->m_vertexPosData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar2[3].m_data[0] = -0.1;
  pVVar2[3].m_data[1] = -0.7;
  pVVar2[3].m_data[2] = 0.0;
  pVVar2[3].m_data[3] = 1.0;
  pVVar2 = (this_02->m_vertexPosData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar2[4].m_data[0] = 0.5;
  pVVar2[4].m_data[1] = 0.0;
  pVVar2[4].m_data[2] = 0.0;
  pVVar2[4].m_data[3] = 1.0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this_02->m_vertexAttrData,(long)this_02->m_numDrawVertices);
  pVVar2 = (this_02->m_vertexAttrData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar2->m_data[0] = 0.0;
  pVVar2->m_data[1] = 0.0;
  pVVar2->m_data[2] = 0.0;
  pVVar2->m_data[3] = 0.0;
  pVVar2 = (this_02->m_vertexAttrData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar2[1].m_data[0] = 1.0;
  pVVar2[1].m_data[1] = 0.0;
  pVVar2[1].m_data[2] = 0.0;
  pVVar2[1].m_data[3] = 0.0;
  pVVar2 = (this_02->m_vertexAttrData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar2[2].m_data[0] = 2.0;
  pVVar2[2].m_data[1] = 0.0;
  pVVar2[2].m_data[2] = 0.0;
  pVVar2[2].m_data[3] = 0.0;
  pVVar2 = (this_02->m_vertexAttrData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar2[3].m_data[0] = 3.0;
  pVVar2[3].m_data[1] = 0.0;
  pVVar2[3].m_data[2] = 0.0;
  pVVar2[3].m_data[3] = 0.0;
  pVVar2 = (this_02->m_vertexAttrData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar2[4].m_data[0] = 0.0;
  pVVar2[4].m_data[1] = 0.0;
  pVVar2[4].m_data[2] = 0.0;
  pVVar2[4].m_data[3] = 0.0;
  if (*(char *)&this_02[1].super_TestInstance._vptr_TestInstance == '\x01') {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)this_00,
               (long)this_02->m_numDrawVertices);
    pCVar3 = this_02[1].super_TestInstance.m_context;
    pCVar3->m_testCtx = (TestContext *)0x2ffff00040001;
    *(undefined2 *)&pCVar3->m_platformInterface = 1;
    vk = Context::getDeviceInterface((this_02->super_TestInstance).m_context);
    device = (Allocation *)Context::getDevice((this_02->super_TestInstance).m_context);
    pAVar5 = Context::getDefaultAllocator((this_02->super_TestInstance).m_context);
    __n = *(long *)&this_02[1].m_primitiveType - (long)this_02[1].super_TestInstance.m_context;
    indexBufferParams.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
    indexBufferParams.pNext = (void *)0x0;
    indexBufferParams.flags = 0;
    indexBufferParams.usage = 0x40;
    indexBufferParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
    indexBufferParams.queueFamilyIndexCount = 0;
    indexBufferParams.pQueueFamilyIndices = (deUint32 *)0x0;
    indexBufferParams.size = __n;
    ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&local_a8,vk,(VkDevice)device,
                       &indexBufferParams,(VkAllocationCallbacks *)0x0);
    local_88._16_8_ = local_a8.m_data.deleter.m_device;
    pVStack_70 = local_a8.m_data.deleter.m_allocator;
    local_88._0_8_ = local_a8.m_data.object.m_internal;
    local_88._8_8_ = local_a8.m_data.deleter.m_deviceIface;
    local_a8.m_data.object.m_internal = 0;
    local_a8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
    local_a8.m_data.deleter.m_device = (VkDevice)0x0;
    local_a8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
              ((RefBase<vk::Handle<(vk::HandleType)8>_> *)this_01);
    *(undefined8 *)((long)&this_02[1].m_name.field_2 + 8) = local_88._16_8_;
    *(VkAllocationCallbacks **)&this_02[1].m_numDrawVertices = pVStack_70;
    *this_01 = local_88._0_8_;
    this_02[1].m_name.field_2._M_allocated_capacity = local_88._8_8_;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_a8);
    pvVar7 = this_04;
    ::vk::getBufferMemoryRequirements
              ((VkMemoryRequirements *)local_88,vk,(VkDevice)device,(VkBuffer)*this_01);
    (*pAVar5->_vptr_Allocator[3])(&local_a8,pAVar5,local_88,1);
    local_a8.m_data.object.m_internal = 0;
    data._8_8_ = pvVar7;
    data.ptr = device;
    de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
              ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)this_04,data);
    de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
              ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_a8);
    pVVar2 = (this_04->
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    result = (*vk->_vptr_DeviceInterface[0xc])
                       (vk,device,*this_01,*(undefined8 *)(pVVar2->m_data + 2),
                        *(undefined8 *)pVVar2[1].m_data);
    ::vk::checkResult(result,
                      "vk.bindBufferMemory(device, *m_indicesBuffer, m_allocation->getMemory(), m_allocation->getOffset())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryBasicGeometryShaderTests.cpp"
                      ,0x27a);
    memcpy(*(void **)((this_04->
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[1].m_data + 2),*this_00,__n);
    pVVar2 = (this_04->
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    ::vk::flushMappedMemoryRange
              (vk,(VkDevice)device,(VkDeviceMemory)*(deUint64 *)(pVVar2->m_data + 2),
               *(VkDeviceSize *)pVVar2[1].m_data,__n);
  }
  return &this_02->super_TestInstance;
}

Assistant:

TestInstance* BuiltinVariableRenderTest::createInstance (Context& context) const
{
	if (m_test == TEST_POINT_SIZE && !checkPointSize(context.getInstanceInterface(), context.getPhysicalDevice()))
			TCU_THROW(NotSupportedError, "Missing feature: pointSize");
	return new BuiltinVariableRenderTestInstance(context, getName(), m_test, m_flag);
}